

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_traits.c
# Opt level: O3

mpt_named_traits * mpt_named_traits(char *name,int len)

{
  byte bVar1;
  mpt_named_traits *pmVar2;
  char *__s2;
  mpt_named_traits **ppmVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  ulong uVar7;
  named_traits_chunk *pnVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  
  if ((len != 0 && name != (char *)0x0) && (*name != '\0')) {
    if (len < 0) {
      sVar5 = strlen(name);
      if ((int)sVar5 != 0) {
        iVar4 = strcmp(name,"log");
        if (iVar4 == 0) {
          pcVar10 = "logger";
        }
        else {
          iVar4 = strcmp(name,"iter");
          if (iVar4 == 0) {
            pcVar10 = "iterator";
          }
          else {
            iVar4 = strcmp(name,"out");
            if (iVar4 == 0) {
              pcVar10 = "output";
            }
            else {
              iVar4 = strcmp(name,"meta");
              pcVar10 = "metatype";
              if (iVar4 != 0) {
                pcVar10 = name;
              }
            }
          }
        }
        pnVar8 = meta_types;
        if (meta_types != (named_traits_chunk *)0x0) goto LAB_0011c763;
        _meta_init();
        for (pnVar8 = meta_types; pnVar8 != (named_traits_chunk *)0x0; pnVar8 = pnVar8->next) {
LAB_0011c763:
          bVar1 = pnVar8->used;
          if ((ulong)bVar1 != 0) {
            uVar7 = 0;
            do {
              pmVar2 = pnVar8->traits[uVar7];
              __s2 = pmVar2->name;
              if ((__s2 != (char *)0x0) && (iVar4 = strcmp(pcVar10,__s2), iVar4 == 0)) {
                return pmVar2;
              }
              uVar7 = uVar7 + 1;
            } while (bVar1 != uVar7);
          }
        }
        if (interface_types == (mpt_named_traits **)0x0) {
          _interfaces_init();
        }
        ppmVar3 = interface_types;
        lVar9 = (long)interface_pos;
        if (0 < lVar9) {
          lVar11 = 0;
          do {
            pmVar2 = ppmVar3[lVar11];
            if (((pmVar2 != (mpt_named_traits *)0x0) && (pmVar2->name != (char *)0x0)) &&
               (iVar4 = strcmp(pcVar10,pmVar2->name), iVar4 == 0)) {
              return pmVar2;
            }
            lVar11 = lVar11 + 1;
          } while (lVar9 != lVar11);
        }
      }
    }
    else {
      pnVar8 = meta_types;
      if (meta_types != (named_traits_chunk *)0x0) goto LAB_0011c69c;
      _meta_init();
      for (pnVar8 = meta_types; pnVar8 != (named_traits_chunk *)0x0; pnVar8 = pnVar8->next) {
LAB_0011c69c:
        bVar1 = pnVar8->used;
        if ((ulong)bVar1 != 0) {
          uVar7 = 0;
          do {
            pmVar2 = pnVar8->traits[uVar7];
            pcVar10 = pmVar2->name;
            if (((pcVar10 != (char *)0x0) && (sVar5 = strlen(pcVar10), (int)sVar5 == len)) &&
               (iVar4 = strncmp(name,pcVar10,(ulong)(uint)len), iVar4 == 0)) {
              return pmVar2;
            }
            uVar7 = uVar7 + 1;
          } while (bVar1 != uVar7);
        }
      }
      if (interface_types == (mpt_named_traits **)0x0) {
        _interfaces_init();
      }
      ppmVar3 = interface_types;
      lVar9 = (long)interface_pos;
      if (0 < lVar9) {
        lVar11 = 0;
        do {
          pmVar2 = ppmVar3[lVar11];
          if (((pmVar2 != (mpt_named_traits *)0x0) &&
              (pcVar10 = pmVar2->name, pcVar10 != (char *)0x0)) &&
             ((sVar5 = strlen(pcVar10), (int)sVar5 == len &&
              (iVar4 = strncmp(name,pcVar10,(ulong)(uint)len), iVar4 == 0)))) {
            return pmVar2;
          }
          lVar11 = lVar11 + 1;
        } while (lVar9 != lVar11);
      }
    }
  }
  piVar6 = __errno_location();
  *piVar6 = 0x16;
  return (mpt_named_traits *)0x0;
}

Assistant:

extern const MPT_STRUCT(named_traits) *mpt_named_traits(const char *name, int len)
{
	const struct named_traits_chunk *ext;
	
	int i;
	
	if (!name || !len || !*name) {
		errno = EINVAL;
		return 0;
	}
	/* exact length match for names */
	if (len >= 0) {
		if (!(ext = meta_types)) {
			_meta_init();
			ext = meta_types;
		}
		while (ext) {
			for (i = 0; i < ext->used; i++) {
				const MPT_STRUCT(named_traits) *elem = ext->traits[i];
				if (elem->name
				 && (len == (int) strlen(elem->name))
				 && !strncmp(name, elem->name, len)) {
					return elem;
				}
			}
			ext = ext->next;
		}
		if (!interface_types) {
			_interfaces_init();
		}
		for (i = 0; i < interface_pos; i++) {
			const MPT_STRUCT(named_traits) *elem;
			if ((elem = interface_types[i])
			 && elem->name
			 && (len == (int) strlen(elem->name))
			 && !strncmp(name, elem->name, len)) {
				return elem;
			}
		}
		errno = EINVAL;
		return 0;
	}
	/* full names without length limit */
	if (!(len = strlen(name))) {
		errno = EINVAL;
		return 0;
	}
	/* resolve shortnames */
	if (!strcmp(name, "log")) {
		name = "logger";
	}
	else if (!strcmp(name, "iter")) {
		name = "iterator";
	}
	else if (!strcmp(name, "out")) {
		name = "output";
	}
	else if (!strcmp(name, "meta")) {
		name = "metatype";
	}
	if (!(ext = meta_types)) {
		_meta_init();
		ext = meta_types;
	}
	while (ext) {
		for (i = 0; i < ext->used; i++) {
			const MPT_STRUCT(named_traits) *elem = ext->traits[i];
			if (elem->name && !strcmp(name, elem->name)) {
				return elem;
			}
		}
		ext = ext->next;
	}
	if (!interface_types) {
		_interfaces_init();
	}
	for (i = 0; i < interface_pos; i++) {
		const MPT_STRUCT(named_traits) *elem = interface_types[i];
		if (elem && elem->name && !strcmp(name, elem->name)) {
			return elem;
		}
	}
	errno = EINVAL;
	return 0;
}